

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_connector_tcp.c
# Opt level: O0

void heartbeat_timeout_cb(uv_timer_t *handle)

{
  int iVar1;
  int ret;
  connector_timer_s *timer;
  uv_timer_t *handle_local;
  
  if (((handle[1].data != (void *)0x0) &&
      (iVar1 = uv_is_closing((uv_handle_t *)((long)handle[1].data + 8)), iVar1 == 0)) &&
     (iVar1 = connector_send_ping((asterism_tcp_connector_s *)handle[1].data), iVar1 != 0)) {
    asterism_stream_close((uv_handle_t *)handle);
  }
  return;
}

Assistant:

static void heartbeat_timeout_cb(
    uv_timer_t *handle)
{
    struct connector_timer_s *timer = __CONTAINER_PTR(struct connector_timer_s, timer, handle);
    if (!timer->connector || uv_is_closing((uv_handle_t *)&timer->connector->socket))
    {
        return;
    }
    int ret = connector_send_ping(timer->connector);
    if (ret != 0)
        asterism_stream_close((uv_handle_t *)handle);
}